

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

int randomx_blake2b_update(blake2b_state *S,void *in,size_t inlen)

{
  int iVar1;
  ulong uVar2;
  uint8_t *pin;
  size_t __n;
  
  iVar1 = 0;
  if (((inlen != 0) && (iVar1 = -1, in != (void *)0x0 && S != (blake2b_state *)0x0)) &&
     (S->f[0] == 0)) {
    uVar2 = (ulong)S->buflen;
    if (0x80 < uVar2 + inlen) {
      __n = 0x80 - uVar2;
      memcpy(S->buf + uVar2,in,__n);
      uVar2 = S->t[0];
      S->t[0] = uVar2 + 0x80;
      S->t[1] = (S->t[1] + 1) - (ulong)(uVar2 < 0xffffffffffffff80);
      blake2b_compress(S,S->buf);
      S->buflen = 0;
      in = (void *)(__n + (long)in);
      for (inlen = inlen - __n; 0x80 < inlen; inlen = inlen - 0x80) {
        uVar2 = S->t[0];
        S->t[0] = uVar2 + 0x80;
        S->t[1] = (S->t[1] + 1) - (ulong)(uVar2 < 0xffffffffffffff80);
        blake2b_compress(S,(uint8_t *)in);
        in = (void *)((long)in + 0x80);
      }
    }
    memcpy(S->buf + S->buflen,in,inlen);
    S->buflen = S->buflen + (int)inlen;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int blake2b_update(blake2b_state *S, const void *in, size_t inlen) {
	const uint8_t *pin = (const uint8_t *)in;

	if (inlen == 0) {
		return 0;
	}

	/* Sanity check */
	if (S == NULL || in == NULL) {
		return -1;
	}

	/* Is this a reused state? */
	if (S->f[0] != 0) {
		return -1;
	}

	if (S->buflen + inlen > BLAKE2B_BLOCKBYTES) {
		/* Complete current block */
		size_t left = S->buflen;
		size_t fill = BLAKE2B_BLOCKBYTES - left;
		memcpy(&S->buf[left], pin, fill);
		blake2b_increment_counter(S, BLAKE2B_BLOCKBYTES);
		blake2b_compress(S, S->buf);
		S->buflen = 0;
		inlen -= fill;
		pin += fill;
		/* Avoid buffer copies when possible */
		while (inlen > BLAKE2B_BLOCKBYTES) {
			blake2b_increment_counter(S, BLAKE2B_BLOCKBYTES);
			blake2b_compress(S, pin);
			inlen -= BLAKE2B_BLOCKBYTES;
			pin += BLAKE2B_BLOCKBYTES;
		}
	}
	memcpy(&S->buf[S->buflen], pin, inlen);
	S->buflen += (unsigned int)inlen;
	return 0;
}